

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STParsedJSON.cpp
# Opt level: O0

optional<jbcoin::detail::STVar> *
jbcoin::STParsedJSONDetail::parseArray
          (optional<jbcoin::detail::STVar> *__return_storage_ptr__,string *json_name,Value *json,
          SField *inName,int depth,Value *error)

{
  bool bVar1;
  UInt UVar2;
  Value *pVVar3;
  reference pvVar4;
  ostream *poVar5;
  pointer_type this;
  SField *pSVar6;
  reference_type object;
  STArray *args;
  bool local_499;
  exception *anon_var_0;
  string local_3f0;
  Value local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  Value local_338;
  undefined1 local_328 [8];
  string errMsg;
  undefined1 local_2e8 [8];
  optional<jbcoin::STObject> ret;
  stringstream ss;
  ostream local_2a0;
  undefined1 local_128 [8];
  Value objectFields;
  Value local_110;
  SField *local_100;
  SField *nameField;
  undefined1 local_e0 [8];
  string objectName;
  Value local_b8;
  bool local_a2;
  byte local_a1;
  UInt local_a0;
  bool singleKey;
  bool isObject;
  UInt i;
  undefined1 local_90 [8];
  STArray tail;
  Value local_60;
  Value local_48;
  Value *local_38;
  Value *error_local;
  SField *pSStack_28;
  int depth_local;
  SField *inName_local;
  Value *json_local;
  string *json_name_local;
  
  local_38 = error;
  error_local._4_4_ = depth;
  pSStack_28 = inName;
  inName_local = (SField *)json;
  json_local = (Value *)json_name;
  json_name_local = (string *)__return_storage_ptr__;
  bVar1 = Json::Value::isArray(json);
  if (bVar1) {
    if (error_local._4_4_ < 0x41) {
      STArray::STArray((STArray *)local_90,pSStack_28);
      local_a0 = 0;
      while( true ) {
        bVar1 = Json::Value::isValidIndex((Value *)inName_local,local_a0);
        if (!bVar1) break;
        pVVar3 = Json::Value::operator[]((Value *)inName_local,local_a0);
        local_a1 = Json::Value::isObject(pVVar3);
        if ((bool)local_a1) {
          pVVar3 = Json::Value::operator[]((Value *)inName_local,local_a0);
          UVar2 = Json::Value::size(pVVar3);
          local_499 = UVar2 == 1;
        }
        else {
          local_499 = true;
        }
        local_a2 = local_499;
        if (((local_a1 & 1) == 0) || (local_499 == false)) {
          singleton_expected((STParsedJSONDetail *)&local_b8,(string *)json_local,local_a0);
          Json::Value::operator=(local_38,&local_b8);
          Json::Value::~Value(&local_b8);
          boost::optional<jbcoin::detail::STVar>::optional(__return_storage_ptr__);
          objectName.field_2._8_4_ = 1;
          goto LAB_00300861;
        }
        pVVar3 = Json::Value::operator[]((Value *)inName_local,local_a0);
        Json::Value::getMemberNames_abi_cxx11_((Members *)&nameField,pVVar3);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&nameField,0);
        std::__cxx11::string::string((string *)local_e0,(string *)pvVar4);
        beast::unit_test::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&nameField);
        local_100 = SField::getField((string *)local_e0);
        bVar1 = SField::operator==(local_100,(SField *)sfInvalid);
        if (bVar1) {
          unknown_field((STParsedJSONDetail *)&local_110,(string *)json_local,(string *)local_e0);
          Json::Value::operator=(local_38,&local_110);
          Json::Value::~Value(&local_110);
          boost::optional<jbcoin::detail::STVar>::optional(__return_storage_ptr__);
          objectName.field_2._8_4_ = 1;
        }
        else {
          pVVar3 = Json::Value::operator[]((Value *)inName_local,local_a0);
          pVVar3 = Json::Value::operator[](pVVar3,(string *)local_e0);
          Json::Value::Value((Value *)local_128,pVVar3);
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)(ret.super_type.m_storage.dummy_.data + 0x28));
          poVar5 = std::operator<<(&local_2a0,(string *)json_local);
          poVar5 = std::operator<<(poVar5,".");
          poVar5 = std::operator<<(poVar5,"[");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_a0);
          poVar5 = std::operator<<(poVar5,"].");
          std::operator<<(poVar5,(string *)local_e0);
          std::__cxx11::stringstream::str();
          parseObject((optional<jbcoin::STObject> *)local_2e8,(string *)((long)&errMsg.field_2 + 8),
                      (Value *)local_128,local_100,error_local._4_4_ + 1,local_38);
          std::__cxx11::string::~string((string *)(errMsg.field_2._M_local_buf + 8));
          bVar1 = boost::optional<jbcoin::STObject>::operator!
                            ((optional<jbcoin::STObject> *)local_2e8);
          if (bVar1) {
            pVVar3 = Json::Value::operator[](local_38,"error_message");
            Json::Value::asString_abi_cxx11_((string *)local_328,pVVar3);
            std::__cxx11::stringstream::str();
            std::operator+(&local_398,"Error at \'",&local_3b8);
            std::operator+(&local_378,&local_398,"\'. ");
            std::operator+(&local_358,&local_378,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_328);
            Json::Value::Value(&local_338,&local_358);
            pVVar3 = Json::Value::operator[](local_38,"error_message");
            Json::Value::operator=(pVVar3,&local_338);
            Json::Value::~Value(&local_338);
            std::__cxx11::string::~string((string *)&local_358);
            std::__cxx11::string::~string((string *)&local_378);
            std::__cxx11::string::~string((string *)&local_398);
            std::__cxx11::string::~string((string *)&local_3b8);
            boost::optional<jbcoin::detail::STVar>::optional(__return_storage_ptr__);
            objectName.field_2._8_4_ = 1;
            std::__cxx11::string::~string((string *)local_328);
          }
          else {
            this = boost::optional<jbcoin::STObject>::operator->
                             ((optional<jbcoin::STObject> *)local_2e8);
            pSVar6 = STBase::getFName(&this->super_STBase);
            if (pSVar6->fieldType == STI_OBJECT) {
              object = boost::optional<jbcoin::STObject>::operator*
                                 ((optional<jbcoin::STObject> *)local_2e8);
              STArray::push_back((STArray *)local_90,object);
              objectName.field_2._8_4_ = 0;
            }
            else {
              std::__cxx11::stringstream::str();
              non_object_in_array((STParsedJSONDetail *)&local_3d0,&local_3f0,local_a0);
              Json::Value::operator=(local_38,&local_3d0);
              Json::Value::~Value(&local_3d0);
              std::__cxx11::string::~string((string *)&local_3f0);
              boost::optional<jbcoin::detail::STVar>::optional(__return_storage_ptr__);
              objectName.field_2._8_4_ = 1;
            }
          }
          boost::optional<jbcoin::STObject>::~optional((optional<jbcoin::STObject> *)local_2e8);
          std::__cxx11::stringstream::~stringstream
                    ((stringstream *)(ret.super_type.m_storage.dummy_.data + 0x28));
          Json::Value::~Value((Value *)local_128);
        }
        std::__cxx11::string::~string((string *)local_e0);
        if (objectName.field_2._8_4_ != 0) goto LAB_00300861;
        local_a0 = local_a0 + 1;
      }
      jbcoin::detail::make_stvar<jbcoin::STArray,jbcoin::STArray>
                ((STVar *)&anon_var_0,(detail *)local_90,args);
      boost::optional<jbcoin::detail::STVar>::optional
                (__return_storage_ptr__,(rval_reference_type)&anon_var_0);
      jbcoin::detail::STVar::~STVar((STVar *)&anon_var_0);
      objectName.field_2._8_4_ = 1;
LAB_00300861:
      STArray::~STArray((STArray *)local_90);
    }
    else {
      too_deep((STParsedJSONDetail *)&local_60,(string *)json_local);
      Json::Value::operator=(local_38,&local_60);
      Json::Value::~Value(&local_60);
      boost::optional<jbcoin::detail::STVar>::optional(__return_storage_ptr__);
    }
  }
  else {
    not_an_array((STParsedJSONDetail *)&local_48,(string *)json_local);
    Json::Value::operator=(local_38,&local_48);
    Json::Value::~Value(&local_48);
    boost::optional<jbcoin::detail::STVar>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static boost::optional <detail::STVar> parseArray (
    std::string const& json_name,
    Json::Value const& json,
    SField const& inName,
    int depth,
    Json::Value& error)
{
    if (! json.isArray ())
    {
        error = not_an_array (json_name);
        return boost::none;
    }

    if (depth > maxDepth)
    {
        error = too_deep (json_name);
        return boost::none;
    }

    try
    {
        STArray tail (inName);

        for (Json::UInt i = 0; json.isValidIndex (i); ++i)
        {
            bool const isObject (json[i].isObject());
            bool const singleKey (isObject ? json[i].size() == 1 : true);

            if (!isObject || !singleKey)
            {
                error = singleton_expected (json_name, i);
                return boost::none;
            }

            // TODO: There doesn't seem to be a nice way to get just the
            // first/only key in an object without copying all keys into
            // a vector
            std::string const objectName (json[i].getMemberNames()[0]);;
            auto const&       nameField (SField::getField(objectName));

            if (nameField == sfInvalid)
            {
                error = unknown_field (json_name, objectName);
                return boost::none;
            }

            Json::Value const objectFields (json[i][objectName]);

            std::stringstream ss;
            ss << json_name << "." <<
                "[" << i << "]." << objectName;

            auto ret = parseObject (ss.str (), objectFields,
                nameField, depth + 1, error);
            if (! ret)
            {
                    std::string errMsg = error["error_message"].asString ();
                    error["error_message"] = "Error at '" + ss.str () +
                        "'. " + errMsg;
                    return boost::none;
            }

            if (ret->getFName().fieldType != STI_OBJECT)
            {
                error = non_object_in_array (ss.str(), i);
                return boost::none;
            }

            tail.push_back (std::move (*ret));
        }

        return detail::make_stvar <STArray> (std::move (tail));
    }
    catch (std::exception const&)
    {
        error = invalid_data (json_name);
        return boost::none;
    }
}